

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetEffectiveFolderName_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  uint uVar1;
  char *pcVar2;
  allocator<char> local_59;
  string local_58;
  char *local_38;
  char *targetFolder;
  undefined1 local_19;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *this_local;
  string *effectiveFolder;
  
  local_19 = 0;
  local_18 = this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar1 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x26])();
  if ((uVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"FOLDER",&local_59);
    pcVar2 = GetProperty(this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    if (pcVar2 != (char *)0x0) {
      local_38 = pcVar2;
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetEffectiveFolderName() const
{
  std::string effectiveFolder;

  if (!this->GlobalGenerator->UseFolderProperty()) {
    return effectiveFolder;
  }

  const char* targetFolder = this->GetProperty("FOLDER");
  if (targetFolder) {
    effectiveFolder += targetFolder;
  }

  return effectiveFolder;
}